

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void phmap::priv::
     Deallocate<8ul,std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,boost::interprocess::allocator<unsigned_long,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
               (scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
                *alloc,void *p,size_t n)

{
  unsigned_long uVar1;
  long lVar2;
  A mem_alloc;
  offset_ptr_internal<unsigned_long,_0UL> local_18;
  offset_ptr_internal<unsigned_long,_0UL> local_10 [2];
  
  if (n != 0) {
    uVar1 = (alloc->
            super_allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
            ).mp_mngr.internal.m_offset;
    lVar2 = 0;
    if (uVar1 != 1) {
      lVar2 = (long)&(alloc->
                     super_allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_boost::interprocess::allocator<unsigned_long,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>
                     ).mp_mngr.internal + uVar1;
    }
    local_10[0].m_offset = lVar2 - (long)local_10;
    if (lVar2 == 0) {
      local_10[0].m_offset = 1;
    }
    local_18.m_offset = (long)p - (long)&local_18;
    if (p == (void *)0x0) {
      local_18.m_offset = 1;
    }
    allocator_traits<std::scoped_allocator_adaptor<boost::interprocess::allocator<M,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>_>
    ::deallocate((scoped_allocator_adaptor<boost::interprocess::allocator<M,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
                  *)local_10,(pointer *)&local_18,n + 7 >> 3);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0x106f,
                "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::scoped_allocator_adaptor<boost::interprocess::allocator<std::pair<const unsigned long, std::vector<unsigned long, boost::interprocess::allocator<unsigned long, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>>, boost::interprocess::segment_manager<char, boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family>, boost::interprocess::iset_index>>>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}